

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
TryGetFixedProperty<false,true>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,
          PropertyRecord *propertyRecord,Var *pProperty,FixedPropertyKind propertyType,
          ScriptContext *requestContext)

{
  DynamicObject *this_00;
  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
  *this_01;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  RecyclableObject *obj;
  undefined4 *puVar5;
  byte *pbVar6;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  
  if (((*(undefined8 **)(this + 0x20) != (undefined8 *)0x0) &&
      (this_00 = (DynamicObject *)**(undefined8 **)(this + 0x20), this_00 != (DynamicObject *)0x0))
     && ((((((this_00->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr == requestContext)) {
    this_01 = *(BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                **)(this + 0x18);
    local_40 = propertyRecord;
    uVar4 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::FindEntryWithKey<Js::PropertyRecord_const*>(this_01,&local_40);
    if ((int)uVar4 < 0) {
      if (((byte)this[0x28] & 2) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xc7e,"(allowNonExistent || isUnordered)",
                                    "Trying to get a fixed function instance for a non-existent property?"
                                   );
        if (!bVar3) {
LAB_00e155c6:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
    else {
      lVar1 = *(long *)(this_01 + 8);
      if ((*(byte *)(lVar1 + (ulong)uVar4 * 0x20) & 4) != 0) {
        pbVar6 = (byte *)(lVar1 + (ulong)uVar4 * 0x20);
        if ((pbVar6[1] & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          propertyRecord_local = (PropertyRecord *)__tls_get_addr(&PTR_01548f08);
          *(undefined4 *)
           &(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0xc6b,"(!(descriptor->Attributes & 0x10))",
                                      "can\'t have fixed global let/const");
          if (!bVar3) goto LAB_00e155c6;
          *(undefined4 *)
           &(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
        }
        if ((uint)local_40->pid < 0x10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          propertyRecord_local = (PropertyRecord *)__tls_get_addr(&PTR_01548f08);
          *(undefined4 *)
           &(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0xc6c,
                                      "(!IsInternalPropertyId(propertyRecord->GetPropertyId()))",
                                      "!IsInternalPropertyId(propertyRecord->GetPropertyId())");
          if (!bVar3) goto LAB_00e155c6;
          *(undefined4 *)
           &(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
        }
        obj = (RecyclableObject *)DynamicObject::GetSlot(this_00,*(int *)(pbVar6 + 4));
        if ((obj != (RecyclableObject *)0x0) &&
           ((((bVar3 = DynamicTypeHandler::IsFixedMethodProperty
                                 ((DynamicTypeHandler *)this,propertyType), (ulong)obj >> 0x30 == 0
              && (bVar3)) && (bVar3 = VarIsImpl<Js::JavascriptFunction>(obj), bVar3)) ||
            (bVar3 = DynamicTypeHandler::IsFixedDataProperty
                               ((DynamicTypeHandler *)this,propertyType), bVar3)))) {
          *pProperty = obj;
          *pbVar6 = *pbVar6 | 8;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        // Note: This function is not thread-safe and cannot be called from the JIT thread.  That's why we collect and
        // cache any fixed function instances during work item creation on the main thread.
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        if (localSingletonInstance != nullptr && localSingletonInstance->GetScriptContext() == requestContext)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->isFixed)
                {
                    AssertMsg(!(descriptor->Attributes & PropertyLetConstGlobal), "can't have fixed global let/const");
                    Assert(!IsInternalPropertyId(propertyRecord->GetPropertyId()));
                    Var value = localSingletonInstance->GetSlot(descriptor->propertyIndex);
                    if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
                    {
                        *pProperty = value;
                        if (markAsUsed)
                        {
                            descriptor->usedAsFixed = true;
                        }
                        return true;
                    }
                }
            }
            else
            {
                // If we're unordered, we may have removed this descriptor from the map and replaced it with a descriptor for a
                // different property. When we do that, we change the type of the instance, but the old type (which may still be
                // in some inline cache) still points to the same type handler.
                AssertMsg(allowNonExistent || isUnordered, "Trying to get a fixed function instance for a non-existent property?");
            }
        }

        return false;
    }